

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O1

void __thiscall
Shell::EqualityProxy::getArgumentEqualityLiterals
          (EqualityProxy *this,uint cnt,LiteralStack *lits,Stack<Kernel::TermList> *vars1,
          Stack<Kernel::TermList> *vars2,OperatorType *symbolType)

{
  sockaddr *__addr;
  uint uVar1;
  TermList TVar2;
  TermList TVar3;
  Literal *pLVar4;
  TermList *pTVar5;
  Stack<Kernel::TermList> *args;
  ulong uVar6;
  sockaddr *psVar7;
  uint64_t local_48;
  sockaddr *local_40;
  sockaddr *local_38;
  
  lits->_cursor = lits->_stack;
  vars1->_cursor = vars1->_stack;
  vars2->_cursor = vars2->_stack;
  args = vars1;
  if (getArgumentEqualityLiterals(unsigned_int,Lib::Stack<Kernel::Literal*>&,Lib::Stack<Kernel::TermList>&,Lib::Stack<Kernel::TermList>&,Kernel::OperatorType*)
      ::localSubst == '\0') {
    getArgumentEqualityLiterals();
  }
  Kernel::Substitution::reset(&getArgumentEqualityLiterals::localSubst);
  if (cnt != 0) {
    uVar6 = 0;
    do {
      uVar1 = (uint)uVar6;
      if (uVar6 < symbolType->_typeArgsArity) {
        TVar2 = Kernel::AtomicSort::superSort();
      }
      else {
        args = (Stack<Kernel::TermList> *)symbolType->_key;
        TVar2._content = (uint64_t)(&args->_stack)[uVar1 - symbolType->_typeArgsArity];
      }
      __addr = (sockaddr *)((ulong)(uVar1 * 8) + 1);
      TVar3 = Kernel::AtomicSort::superSort();
      if (TVar2._content == TVar3._content) {
        Kernel::Substitution::bind
                  (&getArgumentEqualityLiterals::localSubst,uVar1 & 0x3fffffff,__addr,
                   (socklen_t)args);
        if (vars1->_cursor == vars1->_end) {
          ::Lib::Stack<Kernel::TermList>::expand(vars1);
        }
        pTVar5 = vars1->_cursor;
        pTVar5->_content = (uint64_t)__addr;
        vars1->_cursor = pTVar5 + 1;
        pTVar5 = vars2->_cursor;
        psVar7 = __addr;
      }
      else {
        psVar7 = (sockaddr *)((ulong)(uVar1 * 8) | 5);
        TVar2 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                          (TVar2,&getArgumentEqualityLiterals::localSubst,false);
        uVar1 = getProxyPredicate(this);
        args = (Stack<Kernel::TermList> *)&local_48;
        local_48 = TVar2._content;
        local_40 = __addr;
        local_38 = psVar7;
        pLVar4 = Kernel::Literal::create(uVar1,3,false,(TermList *)args);
        if (lits->_cursor == lits->_end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(lits);
        }
        *lits->_cursor = pLVar4;
        lits->_cursor = lits->_cursor + 1;
        if (vars1->_cursor == vars1->_end) {
          ::Lib::Stack<Kernel::TermList>::expand(vars1);
        }
        pTVar5 = vars1->_cursor;
        pTVar5->_content = (uint64_t)__addr;
        vars1->_cursor = pTVar5 + 1;
        pTVar5 = vars2->_cursor;
      }
      if (pTVar5 == vars2->_end) {
        ::Lib::Stack<Kernel::TermList>::expand(vars2);
      }
      pTVar5 = vars2->_cursor;
      pTVar5->_content = (uint64_t)psVar7;
      vars2->_cursor = pTVar5 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar6 != cnt);
  }
  return;
}

Assistant:

void EqualityProxy::getArgumentEqualityLiterals(unsigned cnt, LiteralStack& lits,
    Stack<TermList>& vars1, Stack<TermList>& vars2, OperatorType* symbolType)
{
  ASS_EQ(cnt, symbolType->arity());

  lits.reset();
  vars1.reset();
  vars2.reset();

  static Substitution localSubst;
  localSubst.reset();

  for (unsigned i=0; i<cnt; i++) {
    TermList v1(2*i, false);
    TermList v2(2*i+1, false);
    TermList sort = symbolType->arg(i);
    if(sort != AtomicSort::superSort()){
      lits.push(makeProxyLiteral(false, v1, v2, SubstHelper::apply(sort, localSubst)));
      vars1.push(v1);
      vars2.push(v2);
    } else {
      TermList var = symbolType->quantifiedVar(i);
      localSubst.bind(var.var(), v1);
      vars1.push(v1);
      vars2.push(v1);
    }
  }
}